

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O2

uint128 * __thiscall
pstore::uint128::operator<<(uint128 *__return_storage_ptr__,uint128 *this,uint n)

{
  uint128 *puVar1;
  
  if ((uint)this < 0x81) {
    puVar1 = (uint128 *)
             __ashlti3((long)__return_storage_ptr__->v_,
                       *(undefined8 *)((long)&__return_storage_ptr__->v_ + 8),(ulong)this & 0xff);
    return puVar1;
  }
  assert_failed("n <= 128",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/uint128.hpp"
                ,0x162);
}

Assistant:

uint128 uint128::operator<< (Other const n) const noexcept {
        PSTORE_ASSERT (n <= 128);
#ifdef PSTORE_HAVE_UINT128_T
        return {v_ << n};
#else
        if (n >= 64U) {
            return {low () << (n - 64U), 0U};
        }
        if (n == 0U) {
            return *this;
        }
        std::uint64_t const mask = (std::uint64_t{1} << n) - 1U;
        auto const dist = 64U - n;
        std::uint64_t const top_of_low_mask = mask << dist;
        std::uint64_t const bottom_of_high = (low () & top_of_low_mask) >> dist;
        return {(high () << n) | bottom_of_high, low () << n};
#endif // PSTORE_HAVE_UINT128_T
    }